

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExpandReturning(Parse *pParse,ExprList *pList,Table *pTab)

{
  long lVar1;
  int iVar2;
  Vdbe *pVVar3;
  Expr *pEVar4;
  long in_RDX;
  int *in_RSI;
  long *in_RDI;
  ExprList_item *pItem_1;
  Expr *pNewExpr_1;
  ExprList_item *pItem;
  Expr *pNewExpr;
  int jj;
  Expr *pOldExpr;
  int i;
  sqlite3 *db;
  ExprList *pNew;
  Parse *in_stack_ffffffffffffff98;
  ExprList *in_stack_ffffffffffffffa0;
  sqlite3 *in_stack_ffffffffffffffa8;
  sqlite3 *in_stack_ffffffffffffffb0;
  int local_3c;
  int local_2c;
  ExprList *local_20;
  
  local_20 = (ExprList *)0x0;
  lVar1 = *in_RDI;
  for (local_2c = 0; local_2c < *in_RSI; local_2c = local_2c + 1) {
    if (*(long *)(in_RSI + (long)local_2c * 6 + 2) != 0) {
      iVar2 = isAsteriskTerm(in_stack_ffffffffffffff98,(Expr *)0x215df3);
      if (iVar2 == 0) {
        in_stack_ffffffffffffffa8 =
             (sqlite3 *)
             sqlite3ExprDup(in_stack_ffffffffffffffb0,(Expr *)in_stack_ffffffffffffffa8,
                            (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        local_20 = sqlite3ExprListAppend
                             ((Parse *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              (Expr *)in_stack_ffffffffffffff98);
        if ((*(char *)(lVar1 + 0x67) == '\0') && (*(long *)(in_RSI + (long)local_2c * 6 + 4) != 0))
        {
          in_stack_ffffffffffffffa0 = (ExprList *)(local_20->a + (local_20->nExpr + -1));
          pEVar4 = (Expr *)sqlite3DbStrDup(in_stack_ffffffffffffffa8,
                                           (char *)in_stack_ffffffffffffffa0);
          in_stack_ffffffffffffffa0->a[0].pExpr = pEVar4;
          *(ushort *)
           &((anon_struct_4_9_b482b7ef_for_fg *)&in_stack_ffffffffffffffa0->a[0].zEName)->field_0x1
               = *(ushort *)
                  &((anon_struct_4_9_b482b7ef_for_fg *)&in_stack_ffffffffffffffa0->a[0].zEName)->
                   field_0x1 & 0xfffc | *(ushort *)((long)in_RSI + (long)local_2c * 0x18 + 0x19) & 3
          ;
        }
      }
      else {
        for (local_3c = 0; local_3c < *(short *)(in_RDX + 0x36); local_3c = local_3c + 1) {
          if ((*(ushort *)(*(long *)(in_RDX + 8) + (long)local_3c * 0x10 + 0xe) & 2) == 0) {
            sqlite3Expr(in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                        (char *)in_stack_ffffffffffffff98);
            local_20 = sqlite3ExprListAppend
                                 ((Parse *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                  (Expr *)in_stack_ffffffffffffff98);
            if (*(char *)(lVar1 + 0x67) == '\0') {
              in_stack_ffffffffffffffb0 = (sqlite3 *)(local_20->a + (local_20->nExpr + -1));
              pVVar3 = (Vdbe *)sqlite3DbStrDup(in_stack_ffffffffffffffa8,
                                               (char *)in_stack_ffffffffffffffa0);
              in_stack_ffffffffffffffb0->pVdbe = pVVar3;
              *(ushort *)
               &((anon_struct_4_9_b482b7ef_for_fg *)&in_stack_ffffffffffffffb0->pDfltColl)->
                field_0x1 = *(ushort *)
                             &((anon_struct_4_9_b482b7ef_for_fg *)
                              &in_stack_ffffffffffffffb0->pDfltColl)->field_0x1 & 0xfffc;
            }
          }
        }
      }
    }
  }
  return local_20;
}

Assistant:

static ExprList *sqlite3ExpandReturning(
  Parse *pParse,        /* Parsing context */
  ExprList *pList,      /* The arguments to RETURNING */
  Table *pTab           /* The table being updated */
){
  ExprList *pNew = 0;
  sqlite3 *db = pParse->db;
  int i;

  for(i=0; i<pList->nExpr; i++){
    Expr *pOldExpr = pList->a[i].pExpr;
    if( NEVER(pOldExpr==0) ) continue;
    if( isAsteriskTerm(pParse, pOldExpr) ){
      int jj;
      for(jj=0; jj<pTab->nCol; jj++){
        Expr *pNewExpr;
        if( IsHiddenColumn(pTab->aCol+jj) ) continue;
        pNewExpr = sqlite3Expr(db, TK_ID, pTab->aCol[jj].zCnName);
        pNew = sqlite3ExprListAppend(pParse, pNew, pNewExpr);
        if( !db->mallocFailed ){
          struct ExprList_item *pItem = &pNew->a[pNew->nExpr-1];
          pItem->zEName = sqlite3DbStrDup(db, pTab->aCol[jj].zCnName);
          pItem->fg.eEName = ENAME_NAME;
        }
      }
    }else{
      Expr *pNewExpr = sqlite3ExprDup(db, pOldExpr, 0);
      pNew = sqlite3ExprListAppend(pParse, pNew, pNewExpr);
      if( !db->mallocFailed && ALWAYS(pList->a[i].zEName!=0) ){
        struct ExprList_item *pItem = &pNew->a[pNew->nExpr-1];
        pItem->zEName = sqlite3DbStrDup(db, pList->a[i].zEName);
        pItem->fg.eEName = pList->a[i].fg.eEName;
      }
    }
  }
  return pNew;
}